

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O2

CURLcode httpauth(Curl_easy *data,_Bool proxy,__va_list_tag *param)

{
  uint uVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = param->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (ulong *)((ulong)uVar1 + (long)param->reg_save_area);
    param->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (ulong *)param->overflow_arg_area;
    param->overflow_arg_area = puVar3 + 1;
  }
  uVar5 = *puVar3;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = uVar5 & 0xffffffffffffffe9 | 2;
    if ((uVar5 & 0x10) == 0) {
      uVar4 = uVar5;
    }
    (&(data->state).authhost)[proxy].field_0x18 =
         (&(data->state).authhost)[proxy].field_0x18 & 0xfb | (byte)((uVar5 & 0xffffffff) >> 2) & 4;
    uVar4 = uVar4 & 0xfffffffffffffffb;
    uVar5 = 0;
    do {
      if (uVar5 == 0x1f) {
        return CURLE_NOT_BUILT_IN;
      }
      uVar2 = uVar5 & 0x3f;
      uVar5 = uVar5 + 1;
    } while ((uVar4 >> uVar2 & 1) == 0);
  }
  (&(data->set).httpauth)[proxy] = uVar4;
  return CURLE_OK;
}

Assistant:

static CURLcode httpauth(struct Curl_easy *data, bool proxy, va_list param)
{
  unsigned long auth = va_arg(param, unsigned long);

  if(auth != CURLAUTH_NONE) {
    int bitcheck = 0;
    bool authbits = FALSE;
    /* the DIGEST_IE bit is only used to set a special marker, for all the
       rest we need to handle it as normal DIGEST */
    bool iestyle = !!(auth & CURLAUTH_DIGEST_IE);
    if(proxy)
      data->state.authproxy.iestyle = iestyle;
    else
      data->state.authhost.iestyle = iestyle;

    if(auth & CURLAUTH_DIGEST_IE) {
      auth |= CURLAUTH_DIGEST; /* set standard digest bit */
      auth &= ~CURLAUTH_DIGEST_IE; /* unset ie digest bit */
    }

    /* switch off bits we cannot support */
#ifndef USE_NTLM
    auth &= ~CURLAUTH_NTLM;    /* no NTLM support */
#endif
#ifndef USE_SPNEGO
    auth &= ~CURLAUTH_NEGOTIATE; /* no Negotiate (SPNEGO) auth without GSS-API
                                    or SSPI */
#endif

    /* check if any auth bit lower than CURLAUTH_ONLY is still set */
    while(bitcheck < 31) {
      if(auth & (1UL << bitcheck++)) {
        authbits = TRUE;
        break;
      }
    }
    if(!authbits)
      return CURLE_NOT_BUILT_IN; /* no supported types left! */
  }
  if(proxy)
    data->set.proxyauth = auth;
  else
    data->set.httpauth = auth;
  return CURLE_OK;
}